

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecComputeFlipInvGain(Sfm_Dec_t *p,Abc_Obj_t *pPivot,int *pfNeedInv)

{
  Abc_Obj_t *pNode;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  int iVar1;
  int iGate;
  int iFanin;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  if ((pPivot->vFanouts).nSize < 1) {
    iVar4 = 0;
    iVar5 = 0;
  }
  else {
    lVar3 = 0;
    iVar5 = 0;
    iVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar3]];
      if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
        pGate = (Mio_Gate_t *)(pNode->field_5).pData;
        if (((pNode->vFanins).nSize == 1) && (iVar1 = Mio_GateIsInv(pGate), iVar1 != 0)) {
          iVar5 = iVar5 + p->AreaInv;
        }
        else {
          iGate = Mio_GateReadValue(pGate);
          iVar1 = (pNode->vFanins).nSize;
          iFanin = Abc_NodeFindFanin(pNode,pPivot);
          uVar2 = Sfm_LibFindComplInputGate(&p->vGateFuncs,iGate,iVar1,iFanin,(int *)0x0);
          if (uVar2 == 0xffffffff) {
            iVar4 = 1;
          }
          else {
            if (((int)uVar2 < 0) || ((p->vGateHands).nSize <= (int)uVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pGate_00 = (Mio_Gate_t *)(p->vGateHands).pArray[uVar2];
            dVar6 = Mio_GateReadArea(pGate);
            dVar7 = Mio_GateReadArea(pGate_00);
            iVar5 = (iVar5 + (int)((float)dVar6 * 1000.0)) - (int)((float)dVar7 * 1000.0);
          }
        }
      }
      else {
        iVar4 = 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (pPivot->vFanouts).nSize);
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      iVar5 = iVar5 - p->AreaInv;
    }
  }
  if (pfNeedInv != (int *)0x0) {
    *pfNeedInv = iVar4;
  }
  return iVar5;
}

Assistant:

int Sfm_DecComputeFlipInvGain( Sfm_Dec_t * p, Abc_Obj_t * pPivot, int * pfNeedInv )
{
    Abc_Obj_t * pFanout; 
    Mio_Gate_t * pGate, * pGateNew;
    int i, Handle, fNeedInv = 0, Gain = 0;
    Abc_ObjForEachFanout( pPivot, pFanout, i )
    {
        if ( !Abc_ObjIsNode(pFanout) )
        {
            fNeedInv = 1;
            continue;
        }
        pGate = (Mio_Gate_t*)pFanout->pData;
        if ( Abc_ObjFaninNum(pFanout) == 1 && Mio_GateIsInv(pGate) )
        {
            Gain += p->AreaInv;
            continue;
        }
        Handle = Sfm_LibFindComplInputGate( &p->vGateFuncs, Mio_GateReadValue(pGate), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL );
        if ( Handle == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        pGateNew = (Mio_Gate_t *)Vec_PtrEntry( &p->vGateHands, Handle );
        Gain += Scl_Flt2Int(Mio_GateReadArea(pGate)) - Scl_Flt2Int(Mio_GateReadArea(pGateNew));
    }
    if ( fNeedInv )
        Gain -= p->AreaInv;
    if ( pfNeedInv )
        *pfNeedInv = fNeedInv;
    return Gain;
}